

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O2

bool SpeedAEAD(EVP_AEAD *aead,string *name,size_t ad_len,string *selected)

{
  size_t chunk_len;
  pointer puVar1;
  bool bVar2;
  long lVar3;
  pointer puVar4;
  bool bVar5;
  string local_50;
  
  if ((selected->_M_string_length == 0) ||
     (lVar3 = std::__cxx11::string::find((string *)name,(ulong)selected), lVar3 != -1)) {
    puVar1 = g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar4 = g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar5 = puVar4 == puVar1;
      if (bVar5) {
        return bVar5;
      }
      chunk_len = *puVar4;
      std::__cxx11::string::string((string *)&local_50,(string *)name);
      bVar2 = SpeedAEADChunk(aead,&local_50,chunk_len,ad_len,evp_aead_seal);
      std::__cxx11::string::~string((string *)&local_50);
      puVar4 = puVar4 + 1;
    } while (bVar2);
  }
  else {
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

static bool SpeedAEAD(const EVP_AEAD *aead, const std::string &name,
                      size_t ad_len, const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  for (size_t chunk_len : g_chunk_lengths) {
    if (!SpeedAEADChunk(aead, name, chunk_len, ad_len, evp_aead_seal)) {
      return false;
    }
  }
  return true;
}